

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PostDecTestUint32(void)

{
  bool bVar1;
  SafeIntException *anon_var_0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *this;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  string local_50 [40];
  uint local_28;
  undefined1 in_stack_ffffffffffffffeb;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> t;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar2;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    bVar2 = 1;
    this = (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)&stack0xfffffffffffffff0;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(this,(uint *)(dec_uint32 + local_8 * 0xc));
    in_stack_ffffffffffffffa8 =
         SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         ::operator--((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8.m_int),
                      (int)((ulong)this >> 0x20));
    local_28 = in_stack_ffffffffffffffa8.m_int;
    t = in_stack_ffffffffffffffa8;
    bVar1 = operator!=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(uint)((ulong)this >> 0x20),(uint)this);
    if (bVar1) {
      bVar2 = 0;
    }
    if ((bVar2 & 1) != (dec_uint32[local_8 * 0xc + 8] & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,"Error in case dec_uint32 throw (2): ",
                 (allocator *)&stack0xffffffffffffffaf);
      err_msg<unsigned_int>
                ((string *)CONCAT17(bVar2,in_stack_fffffffffffffff0),t.m_int,
                 (bool)in_stack_ffffffffffffffeb);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    }
  }
  return;
}

Assistant:

void PostDecTestUint32()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint32_t> si(dec_uint32[i].x);
			SafeInt<std::uint32_t> vv = si--;

			if(vv != dec_uint32[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint32[i].fExpected )
		{
			err_msg( "Error in case dec_uint32 throw (2): ", dec_uint32[i].x, dec_uint32[i].fExpected );
		}
	}
}